

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O2

bool __thiscall
pstack::Dwarf::Unit::sourceFromAddr
          (Unit *this,Addr addr,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *info)

{
  int iVar1;
  LineInfo *pLVar2;
  ContainsAddr CVar3;
  unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_> *puVar4;
  bool bVar5;
  pointer pLVar6;
  undefined1 local_90 [8];
  DIE d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  root((DIE *)local_90,this);
  CVar3 = DIE::containsAddress((DIE *)local_90,addr);
  if (CVar3 != NO) {
    puVar4 = getLines(this);
    pLVar2 = (puVar4->_M_t).
             super___uniq_ptr_impl<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstack::Dwarf::LineInfo_*,_std::default_delete<pstack::Dwarf::LineInfo>_>
             .super__Head_base<0UL,_pstack::Dwarf::LineInfo_*,_false>._M_head_impl;
    if (pLVar2 != (LineInfo *)0x0) {
      for (pLVar6 = *(pointer *)
                     &(pLVar2->matrix).
                      super__Vector_base<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>
                      ._M_impl;
          pLVar6 != *(pointer *)
                     ((long)&(pLVar2->matrix).
                             super__Vector_base<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>
                     + 8); pLVar6 = pLVar6 + 1) {
        if ((((pLVar6->field_0x18 & 4) == 0) && (pLVar6->addr <= addr)) && (addr < pLVar6[1].addr))
        {
          iVar1 = ((this->dwarf->elf).
                   super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  context->verbose;
          if (iVar1 == 0) {
            std::__cxx11::string::string((string *)&local_48,&pLVar6->file->name);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &d.unit.
                            super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((ulong)*(uint *)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&pLVar6->file->dirindex)->_M_dataplus)._M_p * 0x20
                           + *(long *)&(pLVar2->directories).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl),"/");
            std::operator+(&local_48,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &d.unit.
                            super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,&pLVar6->file->name);
          }
          std::
          vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
          ::emplace_back<std::__cxx11::string,unsigned_int&>
                    ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                      *)info,&local_48,&pLVar6->line);
          std::__cxx11::string::~string((string *)&local_48);
          if (iVar1 != 0) {
            std::__cxx11::string::~string
                      ((string *)
                       &d.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          bVar5 = true;
          goto LAB_0015ef34;
        }
      }
    }
  }
  bVar5 = false;
LAB_0015ef34:
  DIE::~DIE((DIE *)local_90);
  return bVar5;
}

Assistant:

bool
Unit::sourceFromAddr(Elf::Addr addr, std::vector<std::pair<std::string, int>> &info) {
    DIE d = root();
    if (d.containsAddress(addr) == ContainsAddr::NO)
        return false;
    const auto &lines = getLines();
    if (lines != nullptr) {
        for (auto i = lines->matrix.begin(); i != lines->matrix.end(); ++i) {
            if (i->end_sequence)
                continue;
            auto next = i+1;
            if (i->addr <= addr && next->addr > addr) {
                const std::string &dirname = lines->directories[i->file->dirindex];
                info.emplace_back(dwarf->elf->context.verbose != 0 ? dirname + "/" + i->file->name : i->file->name, i->line);
                return true;
            }
        }
    }
    return false;
}